

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  long *plVar1;
  long lVar2;
  SUNMatrix_ID SVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long local_50;
  
  SVar3 = SUNMatGetID(A);
  if (SVar3 != SUNMATRIX_BAND) {
    return;
  }
  fputc(10,(FILE *)outfile);
  local_50 = 0;
  for (lVar4 = 0; plVar1 = (long *)A->content, lVar4 < *plVar1; lVar4 = lVar4 + 1) {
    lVar8 = plVar1[1];
    lVar5 = lVar4 - plVar1[4];
    lVar2 = plVar1[3];
    lVar6 = 0;
    lVar7 = 0;
    if (0 < lVar5) {
      lVar6 = lVar5;
      lVar7 = lVar5;
    }
    while (lVar6 != 0) {
      fprintf((FILE *)outfile,"%12s  ","");
      lVar6 = lVar6 + -1;
    }
    lVar6 = lVar8 + -1;
    if (lVar2 + lVar4 < lVar8) {
      lVar6 = lVar2 + lVar4;
    }
    if (lVar5 < 1) {
      lVar5 = 0;
    }
    lVar8 = local_50 + lVar5 * -8;
    for (; lVar7 <= lVar6; lVar7 = lVar7 + 1) {
      fprintf((FILE *)outfile,"%12g  ",
              *(undefined8 *)
               (lVar8 + *(long *)((long)A->content + 0x28) * 8 +
                        *(long *)(*(long *)((long)A->content + 0x40) + lVar7 * 8)));
      lVar8 = lVar8 + -8;
    }
    fputc(10,(FILE *)outfile);
    local_50 = local_50 + 8;
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  sunindextype i, j, start, finish;

  /* should not be called unless A is a band matrix; 
     otherwise return immediately */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return;

  /* perform operation */
  fprintf(outfile,"\n");
  for (i=0; i<SM_ROWS_B(A); i++) {
    start = SUNMAX(0, i-SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A)-1, i+SM_UBAND_B(A));
    for (j=0; j<start; j++)
      fprintf(outfile,"%12s  ","");
    for (j=start; j<=finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile,"%12Lg  ", SM_ELEMENT_B(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#else
      fprintf(outfile,"%12g  ", SM_ELEMENT_B(A,i,j));
#endif
    }
    fprintf(outfile,"\n");
  }
  fprintf(outfile,"\n");
  return;
}